

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetJoystickUserPointer(int jid,void *pointer)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/input.c"
                  ,0x412,"void glfwSetJoystickUserPointer(int, void *)");
  }
  if ((uint)jid < 0x10) {
    if (_glfw.initialized != 0) {
      if (_glfw.joysticks[(uint)jid].present != 0) {
        _glfw.joysticks[(uint)jid].userPointer = pointer;
      }
      return;
    }
    _glfwInputError(0x10001,(char *)0x0,in_RDX,in_RAX);
    return;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/glfw/src/input.c"
                ,0x413,"void glfwSetJoystickUserPointer(int, void *)");
}

Assistant:

GLFWAPI void glfwSetJoystickUserPointer(int jid, void* pointer)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT();

    js = _glfw.joysticks + jid;
    if (!js->present)
        return;

    js->userPointer = pointer;
}